

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::ExtensionSet::SetAllocatedMessage
          (ExtensionSet *this,int number,FieldType type,FieldDescriptor *descriptor,
          MessageLite *message)

{
  byte *pbVar1;
  byte bVar2;
  _Base_ptr p_Var3;
  _Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
  _Var4;
  LogMessage *pLVar5;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_bool>
  pVar6;
  LogFinisher local_d1;
  LogMessage local_d0;
  LogMessage local_98;
  LogMessage local_60;
  
  if (message == (MessageLite *)0x0) {
    ClearExtension(this,number);
    return;
  }
  local_d0.filename_ = (char *)0x0;
  local_d0.line_ = 0;
  local_d0._20_4_ = 0;
  local_d0.message_._M_dataplus._M_p = (pointer)0x0;
  local_d0.level_ = number;
  pVar6 = std::
          _Rb_tree<int,std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>,std::_Select1st<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>>
          ::_M_emplace_unique<std::pair<int,google::protobuf::internal::ExtensionSet::Extension>>
                    ((_Rb_tree<int,std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>,std::_Select1st<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>>
                      *)this,(pair<int,_google::protobuf::internal::ExtensionSet::Extension> *)
                             &local_d0);
  _Var4 = pVar6.first._M_node;
  _Var4._M_node[1]._M_right = (_Base_ptr)descriptor;
  if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    if (*(char *)((long)&_Var4._M_node[1]._M_left + 1) != '\0') {
      LogMessage::LogMessage
                (&local_98,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/extension_set.cc"
                 ,500);
      pLVar5 = LogMessage::operator<<
                         (&local_98,
                          "CHECK failed: ((*extension).is_repeated ? REPEATED : OPTIONAL) == (OPTIONAL): "
                         );
      LogFinisher::operator=((LogFinisher *)&local_d0,pLVar5);
      LogMessage::~LogMessage(&local_98);
    }
    bVar2 = *(byte *)&_Var4._M_node[1]._M_left;
    if ((byte)(bVar2 - 0x13) < 0xee) {
      LogMessage::LogMessage
                (&local_d0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/extension_set.cc"
                 ,0x35);
      pLVar5 = LogMessage::operator<<
                         (&local_d0,
                          "CHECK failed: type > 0 && type <= WireFormatLite::MAX_FIELD_TYPE: ");
      LogFinisher::operator=((LogFinisher *)&local_60,pLVar5);
      LogMessage::~LogMessage(&local_d0);
    }
    if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)bVar2 * 4) != 10) {
      LogMessage::LogMessage
                (&local_60,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/extension_set.cc"
                 ,500);
      pLVar5 = LogMessage::operator<<
                         (&local_60,
                          "CHECK failed: (cpp_type((*extension).type)) == (WireFormatLite::CPPTYPE_MESSAGE): "
                         );
      LogFinisher::operator=(&local_d1,pLVar5);
      LogMessage::~LogMessage(&local_60);
    }
    p_Var3 = _Var4._M_node[1]._M_parent;
    if (((ulong)_Var4._M_node[1]._M_left & 0x100000) != 0) {
      (**(code **)(*(long *)p_Var3 + 0x28))(p_Var3,message);
      goto LAB_00203e4e;
    }
    if (p_Var3 != (_Base_ptr)0x0) {
      (**(code **)(*(long *)p_Var3 + 8))();
    }
  }
  else {
    *(FieldType *)&_Var4._M_node[1]._M_left = type;
    if ((byte)(type - 0x13) < 0xee) {
      LogMessage::LogMessage
                (&local_d0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/extension_set.cc"
                 ,0x35);
      pLVar5 = LogMessage::operator<<
                         (&local_d0,
                          "CHECK failed: type > 0 && type <= WireFormatLite::MAX_FIELD_TYPE: ");
      LogFinisher::operator=((LogFinisher *)&local_98,pLVar5);
      LogMessage::~LogMessage(&local_d0);
    }
    if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)type * 4) != 10) {
      LogMessage::LogMessage
                (&local_98,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/extension_set.cc"
                 ,0x1ef);
      pLVar5 = LogMessage::operator<<
                         (&local_98,
                          "CHECK failed: (cpp_type(extension->type)) == (WireFormatLite::CPPTYPE_MESSAGE): "
                         );
      LogFinisher::operator=((LogFinisher *)&local_60,pLVar5);
      LogMessage::~LogMessage(&local_98);
    }
    *(undefined1 *)((long)&_Var4._M_node[1]._M_left + 1) = 0;
    pbVar1 = (byte *)((long)&_Var4._M_node[1]._M_left + 2);
    *pbVar1 = *pbVar1 & 0xf;
  }
  _Var4._M_node[1]._M_parent = (_Base_ptr)message;
LAB_00203e4e:
  pbVar1 = (byte *)((long)&_Var4._M_node[1]._M_left + 2);
  *pbVar1 = *pbVar1 & 0xf0;
  return;
}

Assistant:

void ExtensionSet::SetAllocatedMessage(int number, FieldType type,
                                       const FieldDescriptor* descriptor,
                                       MessageLite* message) {
  if (message == NULL) {
    ClearExtension(number);
    return;
  }
  Extension* extension;
  if (MaybeNewExtension(number, descriptor, &extension)) {
    extension->type = type;
    GOOGLE_DCHECK_EQ(cpp_type(extension->type), WireFormatLite::CPPTYPE_MESSAGE);
    extension->is_repeated = false;
    extension->is_lazy = false;
    extension->message_value = message;
  } else {
    GOOGLE_DCHECK_TYPE(*extension, OPTIONAL, MESSAGE);
    if (extension->is_lazy) {
      extension->lazymessage_value->SetAllocatedMessage(message);
    } else {
      delete extension->message_value;
      extension->message_value = message;
    }
  }
  extension->is_cleared = false;
}